

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::objValueReal(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  bool bVar1;
  Status SVar2;
  int iVar3;
  type *ptVar4;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  Real RVar5;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffff38;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  cpp_dec_float<50U,_int,_void> *this_00;
  undefined8 local_98;
  double local_90;
  double local_88 [3];
  undefined8 local_70;
  double *local_68;
  undefined8 local_58;
  double *local_50;
  undefined8 local_40;
  undefined8 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined8 *local_18;
  double *local_10;
  double *local_8;
  
  this_00 = in_RDI;
  SVar2 = status(in_RSI);
  if (SVar2 == UNBOUNDED) {
    RVar5 = realParam(in_RSI,INFTY);
    iVar3 = intParam(in_RSI,OBJSENSE);
    local_88[0] = RVar5 * (double)iVar3;
    local_68 = local_88;
    local_70 = 0;
    local_8 = local_68;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (this_00,RVar5,in_stack_ffffffffffffff40);
  }
  else {
    SVar2 = status(in_RSI);
    if (SVar2 == INFEASIBLE) {
      RVar5 = realParam(in_RSI,INFTY);
      ptVar4 = (type *)((ulong)RVar5 ^ 0x8000000000000000);
      iVar3 = intParam(in_RSI,OBJSENSE);
      local_90 = (double)ptVar4 * (double)iVar3;
      local_50 = &local_90;
      local_58 = 0;
      local_10 = local_50;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (this_00,in_stack_ffffffffffffff48,ptVar4);
    }
    else {
      bVar1 = hasSol(in_RSI);
      if (bVar1) {
        _syncRealSolution(in_stack_ffffffffffffff40);
        local_28 = &(in_RSI->_solReal)._objVal;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
      }
      else {
        local_98 = 0;
        local_38 = &local_98;
        local_40 = 0;
        local_18 = local_38;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (this_00,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      }
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

R SoPlexBase<R>::objValueReal()
{
   assert(OBJSENSE_MAXIMIZE == 1);
   assert(OBJSENSE_MINIMIZE == -1);

   if(status() == SPxSolverBase<R>::UNBOUNDED)
      return realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(status() == SPxSolverBase<R>::INFEASIBLE)
      return -realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(hasSol())
   {
      _syncRealSolution();
      return _solReal._objVal;
   }
   else
      return 0.0;
}